

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_test.cpp
# Opt level: O2

void __thiscall Pow2_Basics_Test::TestBody(Pow2_Basics_Test *this)

{
  char *pcVar1;
  uint uVar2;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertionResult gtest_ar;
  
  for (uVar2 = 0; uVar2 != 0x20; uVar2 = uVar2 + 1) {
    local_48.ptr_._0_1_ = 1;
    local_50.data_._0_1_ = 1;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"true","IsPowerOf2(ui)",(bool *)&local_48,(bool *)&local_50);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      pcVar1 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                 ,0x13,pcVar1);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    if (uVar2 != 0) {
      local_48.ptr_._0_1_ = 0;
      local_50.data_._0_1_ = 0;
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&gtest_ar,"false","IsPowerOf2(ui + 1)",(bool *)&local_48,
                 (bool *)&local_50);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_48);
        pcVar1 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                   ,0x15,pcVar1);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      if (uVar2 != 1) {
        local_48.ptr_._0_1_ = 0;
        local_50.data_._0_1_ = POPCOUNT(-1 << (uVar2 & 0x1f)) == 0x1f;
        testing::internal::CmpHelperEQ<bool,bool>
                  ((internal *)&gtest_ar,"false","IsPowerOf2(ui - 1)",(bool *)&local_48,
                   (bool *)&local_50);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_48);
          pcVar1 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                     ,0x18,pcVar1);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_48);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
    }
  }
  return;
}

Assistant:

TEST(Pow2, Basics) {
    for (int i = 0; i < 32; ++i) {
        uint32_t ui = 1u << i;
        EXPECT_EQ(true, IsPowerOf2(ui));
        if (ui > 1) {
            EXPECT_EQ(false, IsPowerOf2(ui + 1));
        }
        if (ui > 2) {
            EXPECT_EQ(false, IsPowerOf2(ui - 1));
        }
    }
}